

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void get_range<float,long>
               (size_t col_num,size_t nrows,float *Xc,long *Xc_ind,long *Xc_indptr,
               MissingAction missing_action,double *xmin,double *xmax,bool *unsplittable)

{
  long lVar1;
  bool bVar2;
  long ix;
  long lVar3;
  undefined4 uVar4;
  double dVar5;
  double dVar6;
  undefined4 uVar7;
  double __x;
  
  *xmin = INFINITY;
  *xmax = -INFINITY;
  lVar3 = Xc_indptr[col_num];
  lVar1 = Xc_indptr[col_num + 1];
  if ((ulong)(lVar1 - lVar3) < nrows) {
    *xmin = 0.0;
    *xmax = 0.0;
    uVar7 = 0;
    __x = 0.0;
  }
  else {
    __x = INFINITY;
    uVar7 = 0xfff00000;
  }
  uVar4 = 0;
  if (missing_action == Fail) {
    for (; lVar3 < lVar1; lVar3 = lVar3 + 1) {
      dVar5 = (double)Xc[lVar3];
      dVar6 = dVar5;
      if (__x <= dVar5) {
        dVar6 = __x;
      }
      *xmin = dVar6;
      if (dVar5 <= (double)CONCAT44(uVar7,uVar4)) {
        dVar5 = (double)CONCAT44(uVar7,uVar4);
      }
      *xmax = dVar5;
      uVar4 = SUB84(dVar5,0);
      uVar7 = (undefined4)((ulong)dVar5 >> 0x20);
      __x = dVar6;
    }
  }
  else {
    for (; lVar3 < lVar1; lVar3 = lVar3 + 1) {
      if (ABS(Xc[lVar3]) != INFINITY) {
        dVar5 = (double)Xc[lVar3];
        __x = fmin(__x,dVar5);
        *xmin = __x;
        dVar5 = fmax((double)CONCAT44(uVar7,uVar4),dVar5);
        uVar4 = SUB84(dVar5,0);
        uVar7 = (undefined4)((ulong)dVar5 >> 0x20);
        *xmax = dVar5;
      }
    }
  }
  bVar2 = true;
  if (((__x != (double)CONCAT44(uVar7,uVar4)) || (NAN(__x) || NAN((double)CONCAT44(uVar7,uVar4))))
     && (__x != INFINITY || (double)CONCAT44(uVar7,uVar4) != -INFINITY)) {
    bVar2 = NAN((double)CONCAT44(uVar7,uVar4)) || NAN((double)CONCAT44(uVar7,uVar4));
  }
  *unsplittable = bVar2;
  return;
}

Assistant:

void get_range(size_t col_num, size_t nrows,
               real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;

    if ((size_t)(Xc_indptr[col_num+1] - Xc_indptr[col_num]) < nrows)
    {
        xmin = 0;
        xmax = 0;
    }

    if (missing_action == Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            xmin = (Xc[ix] < xmin)? Xc[ix] : xmin;
            xmax = (Xc[ix] > xmax)? Xc[ix] : xmax;
        }
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            if (unlikely(std::isinf(Xc[ix]))) continue;
            xmin = std::fmin(xmin, Xc[ix]);
            xmax = std::fmax(xmax, Xc[ix]);
        }
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}